

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.hpp
# Opt level: O2

void __thiscall
ddd::DaTrie<false,_true,_true>::edge_
          (DaTrie<false,_true,_true> *this,uint32_t node_pos,Edge *edge,size_t upper)

{
  uint8_t uVar1;
  Bc BVar2;
  ulong uVar3;
  size_t sVar4;
  pointer pNVar5;
  pointer pNVar6;
  ulong uVar7;
  
  edge->size_ = 0;
  BVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
          super__Vector_impl_data._M_start[node_pos];
  uVar3 = (ulong)BVar2 & 0x7fffffff;
  if (uVar3 != 0x7fffffff && -1 < BVar2._0_4_) {
    uVar1 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
            _M_impl.super__Vector_impl_data._M_start[node_pos].child;
    edge->size_ = 1;
    edge->labels_[0] = uVar1;
    pNVar5 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pNVar6 = pNVar5 + node_pos;
    sVar4 = 1;
    while (sVar4 < upper) {
      uVar7 = pNVar6->child ^ uVar3;
      uVar1 = pNVar5[uVar7].sib;
      if (uVar1 == pNVar5[node_pos].child) {
        return;
      }
      edge->size_ = sVar4 + 1;
      edge->labels_[sVar4] = uVar1;
      pNVar5 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pNVar6 = (pointer)&pNVar5[uVar7].sib;
      sVar4 = edge->size_;
    }
  }
  return;
}

Assistant:

void clear() { size_ = 0; }